

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyStrncmp(char *zLeft,char *zRight,sxu32 nLen)

{
  byte *pbVar1;
  byte *pbVar2;
  bool bVar3;
  sxi32 local_40;
  byte *local_38;
  uchar *zQ;
  uchar *zP;
  sxu32 nLen_local;
  char *zRight_local;
  char *zLeft_local;
  
  if ((((zLeft == (char *)0x0) || (*zLeft == '\0')) || (zRight == (char *)0x0)) || (*zRight == '\0')
     ) {
    if ((zLeft == (char *)0x0) || (*zLeft == '\0')) {
      bVar3 = true;
      if (zRight != (char *)0x0) {
        bVar3 = *zRight == '\0';
      }
      local_40 = -1;
      if (bVar3) {
        local_40 = 0;
      }
    }
    else {
      local_40 = 1;
    }
    zLeft_local._4_4_ = local_40;
  }
  else {
    local_38 = (byte *)zRight;
    zQ = (uchar *)zLeft;
    zP._4_4_ = nLen;
    if (nLen == 0) {
      zLeft_local._4_4_ = 0;
    }
    else {
      for (; zP._4_4_ != 0; zP._4_4_ = zP._4_4_ - 4) {
        pbVar2 = local_38;
        pbVar1 = zQ;
        if (((*zQ == '\0') || (*local_38 == 0)) || (*zQ != *local_38)) {
LAB_0014ea69:
          zQ = pbVar1;
          local_38 = pbVar2;
          return (uint)*zQ - (uint)*local_38;
        }
        pbVar1 = zQ + 1;
        pbVar2 = local_38 + 1;
        if (zP._4_4_ == 1) {
          return 0;
        }
        if (((*pbVar1 == 0) || (*pbVar2 == 0)) || (*pbVar1 != *pbVar2)) goto LAB_0014ea69;
        pbVar1 = zQ + 2;
        pbVar2 = local_38 + 2;
        if (zP._4_4_ == 2) {
          return 0;
        }
        if (((*pbVar1 == 0) || (*pbVar2 == 0)) || (*pbVar1 != *pbVar2)) goto LAB_0014ea69;
        pbVar1 = zQ + 3;
        pbVar2 = local_38 + 3;
        if (zP._4_4_ == 3) {
          return 0;
        }
        if (((*pbVar1 == 0) || (*pbVar2 == 0)) || (*pbVar1 != *pbVar2)) goto LAB_0014ea69;
        zQ = zQ + 4;
        local_38 = local_38 + 4;
      }
      zLeft_local._4_4_ = 0;
    }
  }
  return zLeft_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 SyStrncmp(const char *zLeft, const char *zRight, sxu32 nLen)
{
	const unsigned char *zP = (const unsigned char *)zLeft;
	const unsigned char *zQ = (const unsigned char *)zRight;

	if( SX_EMPTY_STR(zP) || SX_EMPTY_STR(zQ)  ){
			return SX_EMPTY_STR(zP) ? (SX_EMPTY_STR(zQ) ? 0 : -1) :1;
	}
	if( nLen <= 0 ){
		return 0;
	}
	for(;;){
		if( nLen <= 0 ){ return 0; } if( zP[0] == 0 || zQ[0] == 0 || zP[0] != zQ[0] ){ break; } zP++; zQ++; nLen--;
		if( nLen <= 0 ){ return 0; } if( zP[0] == 0 || zQ[0] == 0 || zP[0] != zQ[0] ){ break; } zP++; zQ++; nLen--;
		if( nLen <= 0 ){ return 0; } if( zP[0] == 0 || zQ[0] == 0 || zP[0] != zQ[0] ){ break; } zP++; zQ++; nLen--;
		if( nLen <= 0 ){ return 0; } if( zP[0] == 0 || zQ[0] == 0 || zP[0] != zQ[0] ){ break; } zP++; zQ++; nLen--;
	}
	return (sxi32)(zP[0] - zQ[0]);
}